

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O3

bool spvtools::val::anon_unknown_0::isMissingOffsetInStruct
               (uint32_t struct_id,ValidationState_t *vstate)

{
  ushort uVar1;
  _Rb_tree_color _Var2;
  uint32_t *puVar3;
  pointer puVar4;
  pointer puVar5;
  _Bit_type *p_Var6;
  bool bVar7;
  uint uVar8;
  Instruction *pIVar9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_color _Var12;
  ulong *puVar13;
  ulong *puVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint32_t *puVar22;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<bool,_std::allocator<bool>_> local_70;
  uint32_t *local_48;
  uint32_t *puStack_40;
  uint *local_38;
  
  pIVar9 = ValidationState_t::FindDef(vstate,struct_id);
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint32_t *)0x0;
  uVar1 = (pIVar9->inst_).opcode;
  if (uVar1 - 0x1c < 2) {
    std::vector<bool,_std::allocator<bool>_>::resize(&local_70,1,true);
    uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar9,1);
    local_48 = (uint32_t *)CONCAT44(local_48._4_4_,uVar8);
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_48);
      puVar22 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar8;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      puVar22 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  else {
    puVar22 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (uVar1 == 0x1e) {
      pIVar9 = ValidationState_t::FindDef(vstate,struct_id);
      local_38 = (uint *)0x0;
      local_48 = (uint32_t *)0x0;
      puStack_40 = (uint32_t *)0x0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
                 (pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 2,
                 (pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      puVar5 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar4 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = local_48;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_40;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_38;
      local_38 = (uint *)0x0;
      local_48 = (uint32_t *)0x0;
      puStack_40 = (uint32_t *)0x0;
      if ((puVar4 != (uint32_t *)0x0) &&
         (operator_delete(puVar4,(long)puVar5 - (long)puVar4), local_48 != (uint32_t *)0x0)) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
      std::vector<bool,_std::allocator<bool>_>::resize
                (&local_70,
                 (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2,false);
      local_48 = (uint32_t *)CONCAT44(local_48._4_4_,struct_id);
      pmVar10 = std::
                map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                ::operator[](&vstate->id_decorations_,(key_type_conflict *)&local_48);
      p_Var6 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
      p_Var11 = (pmVar10->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      puVar22 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      while (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start = puVar22,
            puVar3 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
            (_Rb_tree_header *)p_Var11 != &(pmVar10->_M_t)._M_impl.super__Rb_tree_header) {
        if (p_Var11[1]._M_color == 0x23) {
          _Var2 = p_Var11[2]._M_color;
          if ((long)(int)_Var2 != 0xffffffffffffffff) {
            if ((p_Var11[1]._M_parent)->_M_color == ~_S_red) goto LAB_001b9d8f;
            _Var12 = _Var2 + 0x3f;
            if (-1 < (int)_Var2) {
              _Var12 = _Var2;
            }
            p_Var6[(long)((int)_Var12 >> 6) +
                   ((ulong)(((long)(int)_Var2 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
                 p_Var6[(long)((int)_Var12 >> 6) +
                        ((ulong)(((long)(int)_Var2 & 0x800000000000003fU) < 0x8000000000000001) - 1)
                       ] | 1L << ((byte)_Var2 & 0x3f);
          }
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        puVar22 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
    }
  }
  for (; puVar22 != puVar3; puVar22 = puVar22 + 1) {
    bVar7 = isMissingOffsetInStruct(*puVar22,vstate);
    if (bVar7) goto LAB_001b9d8f;
  }
  uVar21 = (ulong)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  lVar19 = (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
           (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  lVar16 = (long)(uVar21 + lVar19 * 8) >> 2;
  if (lVar16 < 1) {
    uVar20 = 0;
    puVar18 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
  }
  else {
    lVar16 = lVar16 + 1;
    uVar20 = 0;
    puVar14 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    do {
      uVar15 = (uint)uVar20;
      uVar8 = uVar15;
      if ((*puVar14 >> (uVar20 & 0x3f) & 1) == 0) goto LAB_001b9e22;
      if (uVar15 == 0x3f) {
        uVar17 = puVar14[1];
        puVar13 = puVar14 + 1;
        if ((uVar17 & 1) == 0) goto LAB_001b9de8;
        uVar20 = 2;
        uVar15 = 1;
        puVar14 = puVar13;
        uVar8 = uVar15;
        if ((uVar17 & 2) == 0) goto LAB_001b9e22;
LAB_001b9d4c:
        uVar8 = (uint)uVar20;
        puVar14 = puVar13;
        if ((uVar17 >> (uVar20 & 0x3f) & 1) == 0) goto LAB_001b9e22;
        puVar14 = puVar13 + (uVar8 == 0x3f);
        uVar20 = (ulong)(uVar15 + 2);
        if (uVar8 == 0x3f) {
          uVar20 = 0;
        }
      }
      else {
        uVar8 = uVar15 + 1;
        if ((*puVar14 >> ((ulong)uVar8 & 0x3f) & 1) == 0) goto LAB_001b9e22;
        puVar13 = puVar14 + (uVar8 == 0x3f);
        uVar20 = (ulong)(uVar15 + 2);
        if (uVar8 == 0x3f) {
          uVar20 = 0;
        }
        uVar15 = (uint)uVar20;
        uVar17 = *puVar13;
        puVar14 = puVar13;
        uVar8 = uVar15;
        if ((uVar17 >> (uVar20 & 0x3f) & 1) == 0) goto LAB_001b9e22;
        if (uVar15 != 0x3f) {
          uVar20 = (ulong)(uVar15 + 1);
          goto LAB_001b9d4c;
        }
        puVar14 = puVar13 + 1;
        uVar20 = 1;
        if ((puVar13[1] & 1) == 0) {
          uVar8 = 0;
          goto LAB_001b9e22;
        }
      }
      lVar16 = lVar16 + -1;
    } while (1 < lVar16);
    lVar19 = (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)puVar14;
    uVar21 = uVar21 - uVar20;
    puVar18 = puVar14;
  }
  uVar15 = (uint)uVar20;
  lVar16 = uVar21 + lVar19 * 8;
  puVar13 = puVar18;
  if (lVar16 == 1) {
LAB_001b9e0f:
    puVar14 = puVar13;
    uVar8 = (uint)uVar20;
    if ((*puVar13 >> (uVar20 & 0x3f) & 1) != 0) {
      puVar14 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p;
      uVar8 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset;
    }
  }
  else if (lVar16 == 3) {
    uVar21 = *puVar18;
    puVar14 = puVar18;
    uVar8 = uVar15;
    if ((uVar21 >> (uVar20 & 0x3f) & 1) != 0) {
      if (uVar15 != 0x3f) {
        uVar15 = uVar15 + 1;
        uVar20 = (ulong)uVar15;
        goto LAB_001b9df1;
      }
      puVar13 = puVar18 + 1;
      uVar20 = 1;
      if ((puVar18[1] & 1) != 0) goto LAB_001b9e0f;
LAB_001b9de8:
      puVar14 = puVar13;
      uVar8 = 0;
    }
  }
  else {
    puVar14 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p;
    uVar8 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset;
    if (lVar16 == 2) {
      uVar21 = *puVar18;
LAB_001b9df1:
      puVar14 = puVar18;
      uVar8 = uVar15;
      if ((uVar21 >> (uVar20 & 0x3f) & 1) != 0) {
        puVar13 = puVar18 + (uVar15 == 0x3f);
        uVar8 = 0;
        if (uVar15 != 0x3f) {
          uVar8 = uVar15 + 1;
        }
        uVar20 = (ulong)uVar8;
        goto LAB_001b9e0f;
      }
    }
  }
LAB_001b9e22:
  bVar7 = uVar8 != local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset ||
          puVar14 !=
          local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p;
LAB_001b9e2f:
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar7;
LAB_001b9d8f:
  bVar7 = true;
  goto LAB_001b9e2f;
}

Assistant:

bool isMissingOffsetInStruct(uint32_t struct_id, ValidationState_t& vstate) {
  const auto* inst = vstate.FindDef(struct_id);
  std::vector<bool> hasOffset;
  std::vector<uint32_t> struct_members;
  if (inst->opcode() == spv::Op::OpTypeStruct) {
    // Check offsets of member decorations.
    struct_members = getStructMembers(struct_id, vstate);
    hasOffset.resize(struct_members.size(), false);

    for (auto& decoration : vstate.id_decorations(struct_id)) {
      if (spv::Decoration::Offset == decoration.dec_type() &&
          Decoration::kInvalidMember != decoration.struct_member_index()) {
        // Offset 0xffffffff is not valid so ignore it for simplicity's sake.
        if (decoration.params()[0] == 0xffffffff) return true;
        hasOffset[decoration.struct_member_index()] = true;
      }
    }
  } else if (inst->opcode() == spv::Op::OpTypeArray ||
             inst->opcode() == spv::Op::OpTypeRuntimeArray) {
    hasOffset.resize(1, true);
    struct_members.push_back(inst->GetOperandAs<uint32_t>(1u));
  }
  // Look through nested structs (which may be in an array).
  bool nestedStructsMissingOffset = false;
  for (auto id : struct_members) {
    if (isMissingOffsetInStruct(id, vstate)) {
      nestedStructsMissingOffset = true;
      break;
    }
  }
  return nestedStructsMissingOffset ||
         !std::all_of(hasOffset.begin(), hasOffset.end(),
                      [](const bool b) { return b; });
}